

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O0

uint64_t __thiscall spvtools::opt::analysis::ScalarConstant::GetU64BitValue(ScalarConstant *this)

{
  value_type vVar1;
  int iVar2;
  undefined4 extraout_var;
  size_type sVar3;
  undefined4 extraout_var_00;
  const_reference pvVar4;
  undefined4 extraout_var_01;
  ScalarConstant *this_local;
  
  iVar2 = (*(this->super_Constant)._vptr_Constant[0x18])();
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(extraout_var,iVar2));
  if (sVar3 == 2) {
    iVar2 = (*(this->super_Constant)._vptr_Constant[0x18])();
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        CONCAT44(extraout_var_00,iVar2),1);
    vVar1 = *pvVar4;
    iVar2 = (*(this->super_Constant)._vptr_Constant[0x18])();
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        CONCAT44(extraout_var_01,iVar2),0);
    return CONCAT44(vVar1,*pvVar4);
  }
  __assert_fail("words().size() == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/constants.h"
                ,0xb0,"uint64_t spvtools::opt::analysis::ScalarConstant::GetU64BitValue() const");
}

Assistant:

uint64_t GetU64BitValue() const {
    // Relies on unsigned values smaller than 64-bit being zero extended.  See
    // section 2.2.1 of the SPIR-V spec.
    assert(words().size() == 2);
    return static_cast<uint64_t>(words()[1]) << 32 |
           static_cast<uint64_t>(words()[0]);
  }